

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_show_colormap.cxx
# Opt level: O2

int __thiscall ColorMenu::handle(ColorMenu *this,int e)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int scr_h;
  int scr_w;
  int scr_y;
  int scr_x;
  
  iVar6 = 0;
  if (7 < e - 1U) {
    return 0;
  }
  uVar3 = this->which;
  switch(e) {
  case 1:
  case 5:
    iVar6 = Fl::e_x_root - (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.x_;
    uVar9 = iVar6 - 4;
    uVar5 = uVar9 / 0xe;
    if (iVar6 < 4) {
      uVar5 = uVar9;
    }
    iVar6 = Fl::e_y_root - (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.y_;
    uVar9 = iVar6 - 4;
    uVar2 = uVar9 / 0xe;
    if (iVar6 < 4) {
      uVar2 = uVar9;
    }
    uVar1 = *(uint *)&(this->super_Fl_Window).field_0xec;
    uVar9 = uVar5 + uVar2 * 8;
    if (0x1f < uVar2) {
      uVar9 = uVar1;
    }
    if (7 < uVar5) {
      uVar9 = uVar1;
    }
    break;
  case 2:
switchD_001ee94c_caseD_2:
    this->done = 1;
    goto LAB_001eeae5;
  default:
    goto switchD_001ee94c_caseD_3;
  case 8:
    switch(Fl::e_keysym) {
    case 0xff51:
      uVar9 = uVar3 - 1;
      if (uVar3 == 0) {
        uVar9 = 0;
      }
      break;
    case 0xff52:
      uVar9 = uVar3 - 8;
      if (uVar3 < 8) {
        uVar9 = uVar3;
      }
      break;
    case 0xff53:
      uVar9 = uVar3 + (uVar3 < 0xff);
      break;
    case 0xff54:
      uVar9 = uVar3 + 8;
      if (0xf7 < uVar3) {
        uVar9 = uVar3;
      }
      break;
    default:
      if (Fl::e_keysym != 0xff0d) {
        if (Fl::e_keysym == 0xff1b) {
          this->which = *(Fl_Color *)&(this->super_Fl_Window).field_0xec;
        }
        else if (Fl::e_keysym != 0xff8d) {
          return 0;
        }
      }
      goto switchD_001ee94c_caseD_2;
    }
  }
  if (uVar9 == uVar3) {
LAB_001eeae5:
    iVar6 = 1;
  }
  else {
    this->which = uVar9;
    iVar6 = 1;
    Fl_Widget::damage((Fl_Widget *)this,'\x01');
    uVar3 = uVar9 & 7;
    uVar9 = uVar9 >> 3;
    iVar8 = (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.x_;
    iVar7 = (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.y_;
    Fl::screen_xywh(&scr_x,&scr_y,&scr_w,&scr_h);
    if (iVar8 <= scr_x) {
      iVar8 = scr_x;
    }
    iVar4 = scr_x + scr_w + uVar3 * -0xe + -0x16;
    if ((int)(uVar3 * 0xe + iVar8 + 0x16) < scr_x + scr_w) {
      iVar4 = iVar8;
    }
    if (iVar7 <= scr_y) {
      iVar7 = scr_y;
    }
    iVar8 = scr_y + scr_h + uVar9 * -0xe + -0x16;
    if ((int)(uVar9 * 0xe + iVar7 + 0x16) < scr_y + scr_h) {
      iVar8 = iVar7;
    }
    iVar7 = uVar3 * -0xe;
    if (3 < (int)(uVar3 * 0xe + iVar4 + 4)) {
      iVar7 = iVar4;
    }
    iVar4 = uVar9 * -0xe;
    if (3 < (int)(uVar9 * 0xe + iVar8 + 4)) {
      iVar4 = iVar8;
    }
    Fl_Widget::position((Fl_Widget *)this,iVar7,iVar4);
  }
switchD_001ee94c_caseD_3:
  return iVar6;
}

Assistant:

int ColorMenu::handle(int e) {
  Fl_Color c = which;
  switch (e) {
  case FL_PUSH:
  case FL_DRAG: {
    int X = (Fl::event_x_root() - x() - BORDER);
    if (X >= 0) X = X/BOXSIZE;
    int Y = (Fl::event_y_root() - y() - BORDER);
    if (Y >= 0) Y = Y/BOXSIZE;
    if (X >= 0 && X < 8 && Y >= 0 && Y < 32)
      c = 8*Y + X;
    else
      c = initial;
    } break;
  case FL_RELEASE:
    done = 1;
    return 1;
  case FL_KEYBOARD:
    switch (Fl::event_key()) {
    case FL_Up: if (c > 7) c -= 8; break;
    case FL_Down: if (c < 256-8) c += 8; break;
    case FL_Left: if (c > 0) c--; break;
    case FL_Right: if (c < 255) c++; break;
    case FL_Escape: which = initial; done = 1; return 1;
    case FL_KP_Enter:
    case FL_Enter: done = 1; return 1;
    default: return 0;
    }
    break;
  default:
    return 0;
  }
  if (c != which) {
    which = (Fl_Color)c; damage(FL_DAMAGE_CHILD);
    int bx = (c%8)*BOXSIZE+BORDER;
    int by = (c/8)*BOXSIZE+BORDER;
    int px = x();
    int py = y();
    int scr_x, scr_y, scr_w, scr_h;
    Fl::screen_xywh(scr_x, scr_y, scr_w, scr_h);
    if (px < scr_x) px = scr_x;
    if (px+bx+BOXSIZE+BORDER >= scr_x+scr_w) px = scr_x+scr_w-bx-BOXSIZE-BORDER;
    if (py < scr_y) py = scr_y;
    if (py+by+BOXSIZE+BORDER >= scr_y+scr_h) py = scr_y+scr_h-by-BOXSIZE-BORDER;
    if (px+bx < BORDER) px = BORDER-bx;
    if (py+by < BORDER) py = BORDER-by;
    position(px,py);
  }
  return 1;
}